

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::TriangleMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  BufferView<embree::Vec3fa> *pBVar2;
  long lVar3;
  char *pcVar4;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar5;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar22;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar28;
  undefined1 auVar29 [16];
  
  aVar18 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar19 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar19;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  sVar8 = __return_storage_ptr__->end;
  aVar20 = aVar19;
  aVar21 = aVar18;
  if (uVar13 < r->_end) {
    aVar5 = DAT_01feba00._0_12_;
    aVar6 = DAT_01feb9f0._0_12_;
    do {
      lVar14 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
      pBVar2 = (this->super_TriangleMesh).vertices.items;
      lVar16 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar13;
      uVar12 = (ulong)*(uint *)(lVar14 + lVar16);
      uVar17 = (pBVar2->super_RawBufferView).num;
      if (((uVar12 < uVar17) && (uVar9 = (ulong)*(uint *)(lVar14 + 4 + lVar16), uVar9 < uVar17)) &&
         (uVar15 = (ulong)*(uint *)(lVar14 + 8 + lVar16), uVar15 < uVar17)) {
        uVar17 = (ulong)(this->super_TriangleMesh).super_Geometry.numTimeSteps;
        if (uVar17 != 0) {
          lVar14 = 0;
          do {
            lVar16 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar14);
            lVar3 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar14);
            pfVar1 = (float *)(lVar16 + lVar3 * uVar12);
            auVar26._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar26._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar26._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar26._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar10 = movmskps((int)(lVar3 * uVar12),auVar26);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_00a54c06;
            pfVar1 = (float *)(lVar16 + lVar3 * uVar9);
            auVar27._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar27._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar27._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar27._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar10 = movmskps((int)(lVar3 * uVar9),auVar27);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_00a54c06;
            pfVar1 = (float *)(lVar16 + lVar3 * uVar15);
            auVar23._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar23._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar23._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar23._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar10 = movmskps((int)(lVar3 * uVar15),auVar23);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_00a54c06;
            lVar14 = lVar14 + 0x38;
          } while (uVar17 * 0x38 - lVar14 != 0);
        }
        pcVar4 = (this->super_TriangleMesh).vertices0.super_RawBufferView.ptr_ofs;
        sVar11 = (this->super_TriangleMesh).vertices0.super_RawBufferView.stride;
        auVar26 = minps(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar11),
                        *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar11));
        auVar27 = minps(auVar26,*(undefined1 (*) [16])(pcVar4 + uVar15 * sVar11));
        auVar26 = maxps(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar11),
                        *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar11));
        auVar26 = maxps(auVar26,*(undefined1 (*) [16])(pcVar4 + uVar15 * sVar11));
        bVar7 = true;
        aVar25 = auVar27._0_12_;
        aVar22 = auVar26._0_12_;
      }
      else {
LAB_00a54c06:
        bVar7 = false;
        aVar25 = aVar6;
        aVar22 = aVar5;
      }
      sVar11 = k;
      if (bVar7) {
        aVar28.m128[3] = (float)geomID;
        aVar28._0_4_ = aVar25.x;
        aVar28._4_4_ = aVar25.y;
        aVar28._8_4_ = aVar25.z;
        aVar24.m128[3] = (float)uVar13;
        aVar24._0_4_ = aVar22.x;
        aVar24._4_4_ = aVar22.y;
        aVar24._8_4_ = aVar22.z;
        aVar18.m128 = (__m128)minps(aVar18.m128,aVar28.m128);
        aVar19.m128 = (__m128)maxps(aVar19.m128,aVar24.m128);
        auVar29._0_4_ = aVar25.x + aVar22.x;
        auVar29._4_4_ = aVar25.y + aVar22.y;
        auVar29._8_4_ = aVar25.z + aVar22.z;
        auVar29._12_4_ = (float)geomID + (float)uVar13;
        aVar21.m128 = (__m128)minps(aVar21.m128,auVar29);
        aVar20.m128 = (__m128)maxps(aVar20.m128,auVar29);
        sVar8 = sVar8 + 1;
        sVar11 = k + 1;
        prims[k].lower.field_0 = aVar28;
        prims[k].upper.field_0 = aVar24;
      }
      uVar13 = uVar13 + 1;
      k = sVar11;
    } while (uVar13 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->end = sVar8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }